

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

String testing::internal::StreamableToString<wchar_t*>(wchar_t **streamable)

{
  size_t extraout_RDX;
  Message *in_RSI;
  char *in_RDI;
  String SVar1;
  Message *this;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffe8;
  
  this = (Message *)&stack0xffffffffffffffe8;
  Message::Message(in_RSI);
  Message::operator<<(in_RSI,(wchar_t *)in_stack_ffffffffffffffe8.ptr_);
  Message::GetString(this);
  Message::~Message((Message *)0x21088c);
  SVar1.length_ = extraout_RDX;
  SVar1.c_str_ = in_RDI;
  return SVar1;
}

Assistant:

String StreamableToString(const T& streamable) {
  return (Message() << streamable).GetString();
}